

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  thread *this;
  socklen_t in_ECX;
  uint uVar7;
  char *__s;
  int flags;
  int serverFd;
  Sock server;
  ThreadPool threadsPool;
  unique_ptr<std::thread,_void_(*const)(std::thread_*)> local_90;
  int local_7c;
  char *local_78;
  ulong local_70;
  Sock local_68;
  int *local_50;
  vector<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
  local_48;
  
  if (argc < 6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108258);
    }
    else {
      sVar5 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," -h <ip> -p <port> -d <directory>",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  else {
    local_70 = 0;
    iVar3 = 1;
    local_78 = (char *)0x0;
    pcVar1 = (char *)0x0;
    while( true ) {
      while (__s = pcVar1, iVar2 = getopt(argc,argv,"h:p:d:D:"), pcVar1 = __s, 99 < iVar2) {
        pcVar1 = _optarg;
        if (iVar2 != 100) {
          if (iVar2 == 0x70) {
            iVar2 = atoi(_optarg);
            local_70 = CONCAT44(extraout_var,iVar2);
            pcVar1 = __s;
          }
          else {
            pcVar1 = __s;
            if (iVar2 == 0x68) {
              local_78 = _optarg;
            }
          }
        }
      }
      if (iVar2 == -1) break;
      if (iVar2 == 0x44) {
        iVar3 = atoi(_optarg);
      }
    }
    if (iVar3 != 0) {
      daemonize("/tmp",(char *)0x0);
    }
    local_48.
    super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.m_domain = 2;
    local_68.m_socktype = 1;
    local_68.m_closeOnDestroy = false;
    local_68.m_BACKLOG_NUM = 10;
    local_68.m_sid = socket(2,1,0);
    pcVar1 = local_78;
    if (local_68.m_sid < 0) {
      perror("socket");
    }
    else {
      iVar2 = (int)local_70;
      iVar3 = Sock::bind(&local_68,(int)local_78,(sockaddr *)(local_70 & 0xffffffff),in_ECX);
      if (-1 < iVar3) {
        local_90._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
        super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
        super__Tuple_impl<1UL,_void_(*const)(std::thread_*)>.
        super__Head_base<1UL,_void_(*const)(std::thread_*),_false>._M_head_impl._0_4_ = 1;
        iVar3 = ioctl(local_68.m_sid,0x5421);
        if (iVar3 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"created server socket for: ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"host = ",7);
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1081a0);
          }
          else {
            sVar5 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," port = ",8);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," directory = ",0xd);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar5);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          local_7c = local_68.m_sid;
          iVar3 = std::thread::hardware_concurrency();
          if (iVar3 != 0) {
            uVar7 = 0;
            do {
              this = (thread *)operator_new(8);
              local_50 = &local_7c;
              std::thread::thread<void(&)(void*),int*,void>(this,clientRead,&local_50);
              local_90._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
              super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
              super__Tuple_impl<1UL,_void_(*const)(std::thread_*)>.
              super__Head_base<1UL,_void_(*const)(std::thread_*),_false>._M_head_impl =
                   (_Head_base<1UL,_void_(*const)(std::thread_*),_false>)
                   ThreadPool::anon_class_1_0_00000001::__invoke;
              local_90._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
              super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
              super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = this;
              std::
              vector<std::unique_ptr<std::thread,void(*const)(std::thread*)>,std::allocator<std::unique_ptr<std::thread,void(*const)(std::thread*)>>>
              ::emplace_back<std::unique_ptr<std::thread,void(*const)(std::thread*)>>
                        ((vector<std::unique_ptr<std::thread,void(*const)(std::thread*)>,std::allocator<std::unique_ptr<std::thread,void(*const)(std::thread*)>>>
                          *)&local_48,&local_90);
              if (local_90._M_t.super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>.
                  _M_t.super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
                  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
                (*(code *)local_90._M_t.
                          super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
                          super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
                          super__Tuple_impl<1UL,_void_(*const)(std::thread_*)>.
                          super__Head_base<1UL,_void_(*const)(std::thread_*),_false>._M_head_impl)
                          (local_90._M_t.
                           super___uniq_ptr_impl<std::thread,_void_(*const)(std::thread_*)>._M_t.
                           super__Tuple_impl<0UL,_std::thread_*,_void_(*const)(std::thread_*)>.
                           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl);
              }
              uVar7 = uVar7 + 1;
              uVar4 = std::thread::hardware_concurrency();
            } while (uVar7 < uVar4);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"cannot set for server socket nonblock mode",0x2a);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
        }
      }
    }
    Sock::~Sock(&local_68);
    std::
    vector<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>,_std::allocator<std::unique_ptr<std::thread,_void_(*const)(std::thread_*)>_>_>
    ::~vector(&local_48);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc < 6)
  {
    std::cerr << "usage: " << argv[0] << " -h <ip> -p <port> -d <directory>" << std::endl;
    return 0;
  }

  globalArgs_t globalArgs {nullptr, nullptr, 0, 1};
  static const char* optString = "h:p:d:D:";
  int opt = 0;

  opt = getopt( argc, argv, optString );
  while(opt != -1)
  {
    switch(opt)
    {
      case 'h':
        globalArgs.m_host = optarg;
        break;

      case 'p':
        globalArgs.m_port = atoi(optarg);
        break;

      case 'd':
        globalArgs.m_directory = optarg;
        break;

      case 'D':
      globalArgs.daemonize = atoi(optarg);
      break;

      default:
        break;
    }

    opt = getopt(argc, argv, optString);
  }

  if (globalArgs.daemonize)
    daemonize("/tmp");

  ThreadPool threadsPool;

  /* create a server socket */
  Sock server(AF_INET, SOCK_STREAM);
  if (!server.good())
    return 0;

  if (server.bind(globalArgs.m_host, globalArgs.m_port) < 0)
    return 0;

  if (server.setNonblock() != 0)
  {
    std::cerr << "cannot set for server socket nonblock mode" << std::endl;
    return 0;
  }

  std::cout << "created server socket for: "
            << "host = " << globalArgs.m_host
            << " port = " << globalArgs.m_port
            << " directory = " << globalArgs.m_directory
            << std::endl;

  int serverFd = server.fd();
  for (int i = 0; i < std::thread::hardware_concurrency(); ++i)
  {
    ThreadPool::ThreadPtr Thread(new std::thread(clientRead, &serverFd), ThreadPool::ThreadDeleter);
    threadsPool.threads.push_back(std::move(Thread));
  }

  return 0;
}